

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::invalidateScene(QGraphicsView *this,QRectF *rect,SceneLayers layers)

{
  long lVar1;
  QRect QVar2;
  char cVar3;
  bool bVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect local_58;
  QRect local_40;
  long local_30;
  
  QVar2._8_8_ = local_40._8_8_;
  QVar2._0_8_ = local_40._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((uint)layers.super_QFlagsStorageHelper<QGraphicsScene::SceneLayer,_4>.
              super_QFlagsStorage<QGraphicsScene::SceneLayer>.i & 2) != 0) &&
     (lVar1 = *(long *)(this + 8), local_40 = QVar2, (*(byte *)(lVar1 + 0x301) & 8) == 0)) {
    mapFromScene((QPolygon *)&local_58,this,rect);
    local_40 = (QRect)QPolygon::boundingRect();
    QArrayDataPointer<QPoint>::~QArrayDataPointer((QArrayDataPointer<QPoint> *)&local_58);
    this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    local_58 = QWidget::rect(this_00);
    cVar3 = QRect::intersects(&local_58);
    if (cVar3 != '\0') {
      QRegion::operator+=((QRegion *)(lVar1 + 0x508),&local_40);
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
      if (bVar4) {
        QGraphicsScene::update(*(QGraphicsScene **)(lVar1 + 0x498),rect);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::invalidateScene(const QRectF &rect, QGraphicsScene::SceneLayers layers)
{
    Q_D(QGraphicsView);
    if ((layers & QGraphicsScene::BackgroundLayer) && !d->mustResizeBackgroundPixmap) {
        QRect viewRect = mapFromScene(rect).boundingRect();
        if (viewport()->rect().intersects(viewRect)) {
            // The updated background area is exposed; schedule this area for
            // redrawing.
            d->backgroundPixmapExposed += viewRect;
            if (d->scene)
                d->scene->update(rect);
        }
    }
}